

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeFabricEdgeGetVerticesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_vertex_handle_t *phVertexA,
          ze_fabric_vertex_handle_t *phVertexB)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeFabricEdgeGetVerticesExp(hEdge, phVertexA, phVertexB)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0x650);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar6 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar5 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar5 * 8);
        result = (**(code **)(*plVar3 + 0xb50))(plVar3,hEdge,phVertexA,phVertexB);
        if (result != ZE_RESULT_SUCCESS) goto LAB_00160f5e;
        lVar5 = lVar5 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    lVar5 = context;
    if ((*(char *)(context + 4) != '\x01') ||
       (result = ZEHandleLifetimeValidation::zeFabricEdgeGetVerticesExpPrologue
                           (*(ZEHandleLifetimeValidation **)(context + 0xd48),hEdge,phVertexA,
                            phVertexB), result == ZE_RESULT_SUCCESS)) {
      zVar4 = (*pcVar1)(hEdge,phVertexA,phVertexB);
      if (lVar2 != lVar7) {
        lVar7 = 0;
        do {
          plVar3 = (long *)**(undefined8 **)(*(long *)(lVar5 + 0xd30) + lVar7 * 8);
          result = (**(code **)(*plVar3 + 0xb58))(plVar3,hEdge,phVertexA,phVertexB,zVar4);
          if (result != ZE_RESULT_SUCCESS) goto LAB_00160f5e;
          lVar7 = lVar7 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
      }
      result = zVar4;
      if ((zVar4 == ZE_RESULT_SUCCESS) && (*(char *)(lVar5 + 4) == '\x01')) {
        if (phVertexA != (ze_fabric_vertex_handle_t *)0x0) {
          HandleLifetimeValidation::addHandle
                    (*(HandleLifetimeValidation **)(lVar5 + 0xd48),*phVertexA);
          HandleLifetimeValidation::addDependent
                    (*(HandleLifetimeValidation **)(lVar5 + 0xd48),hEdge,*phVertexA);
        }
        if (phVertexB != (ze_fabric_vertex_handle_t *)0x0) {
          HandleLifetimeValidation::addHandle
                    (*(HandleLifetimeValidation **)(lVar5 + 0xd48),*phVertexB);
          HandleLifetimeValidation::addDependent
                    (*(HandleLifetimeValidation **)(lVar5 + 0xd48),hEdge,*phVertexB);
        }
      }
    }
  }
LAB_00160f5e:
  logAndPropagateResult("zeFabricEdgeGetVerticesExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetVerticesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        context.logger->log_trace("zeFabricEdgeGetVerticesExp(hEdge, phVertexA, phVertexB)");

        auto pfnGetVerticesExp = context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp;

        if( nullptr == pfnGetVerticesExp )
            return logAndPropagateResult("zeFabricEdgeGetVerticesExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeFabricEdgeGetVerticesExpPrologue( hEdge, phVertexA, phVertexB );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeFabricEdgeGetVerticesExpPrologue( hEdge, phVertexA, phVertexB );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }

        auto driver_result = pfnGetVerticesExp( hEdge, phVertexA, phVertexB );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeFabricEdgeGetVerticesExpEpilogue( hEdge, phVertexA, phVertexB ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phVertexA){
                context.handleLifetime->addHandle( *phVertexA );
                context.handleLifetime->addDependent( hEdge, *phVertexA );

            }
            if (phVertexB){
                context.handleLifetime->addHandle( *phVertexB );
                context.handleLifetime->addDependent( hEdge, *phVertexB );

            }
        }
        return logAndPropagateResult("zeFabricEdgeGetVerticesExp", driver_result);
    }